

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

TEdge * ClipperLib::RemoveEdge(TEdge *e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  
  pTVar1 = e->Prev;
  pTVar1->Next = e->Next;
  pTVar2 = e->Next;
  pTVar2->Prev = pTVar1;
  e->Prev = (TEdge *)0x0;
  return pTVar2;
}

Assistant:

TEdge* RemoveEdge(TEdge* e)
{
  //removes e from double_linked_list (but without removing from memory)
  e->Prev->Next = e->Next;
  e->Next->Prev = e->Prev;
  TEdge* result = e->Next;
  e->Prev = 0; //flag as removed (see ClipperBase.Clear)
  return result;
}